

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateAccessorDeclarations
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor **args;
  CType CVar1;
  FieldDescriptor *field;
  CType CVar2;
  Formatter format;
  Formatter local_60;
  
  local_60.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  field = (this->super_FieldGenerator).descriptor_;
  CVar1 = *(CType *)(*(long *)(field + 0x38) + 0x48);
  CVar2 = EffectiveStringCType(field,(this->super_FieldGenerator).options_);
  if (CVar1 != CVar2) {
    io::Printer::Outdent(local_60.printer_);
    Formatter::operator()<>(&local_60," private:\n  // Hidden due to unknown ctype option.\n");
    io::Printer::Indent(local_60.printer_);
  }
  args = &(this->super_FieldGenerator).descriptor_;
  Formatter::operator()
            (&local_60,
             "$deprecated_attr$const std::string& ${1$$name$$}$(int index) const;\n$deprecated_attr$std::string* ${1$mutable_$name$$}$(int index);\n$deprecated_attr$void ${1$set_$name$$}$(int index, const std::string& value);\n$deprecated_attr$void ${1$set_$name$$}$(int index, std::string&& value);\n$deprecated_attr$void ${1$set_$name$$}$(int index, const char* value);\n"
             ,args);
  if (((this->super_FieldGenerator).options_)->opensource_runtime == false) {
    Formatter::operator()
              (&local_60,"$deprecated_attr$void ${1$set_$name$$}$(int index, StringPiece value);\n",
               args);
  }
  Formatter::operator()
            (&local_60,
             "$deprecated_attr$void ${1$set_$name$$}$(int index, const $pointer_type$* value, size_t size);\n$deprecated_attr$std::string* ${1$add_$name$$}$();\n$deprecated_attr$void ${1$add_$name$$}$(const std::string& value);\n$deprecated_attr$void ${1$add_$name$$}$(std::string&& value);\n$deprecated_attr$void ${1$add_$name$$}$(const char* value);\n"
             ,args);
  if (((this->super_FieldGenerator).options_)->opensource_runtime == false) {
    Formatter::operator()
              (&local_60,"$deprecated_attr$void ${1$add_$name$$}$(StringPiece value);\n",args);
  }
  Formatter::operator()
            (&local_60,
             "$deprecated_attr$void ${1$add_$name$$}$(const $pointer_type$* value, size_t size);\n$deprecated_attr$const ::$proto_ns$::RepeatedPtrField<std::string>& ${1$$name$$}$() const;\n$deprecated_attr$::$proto_ns$::RepeatedPtrField<std::string>* ${1$mutable_$name$$}$();\nprivate:\nconst std::string& ${1$_internal_$name$$}$(int index) const;\nstd::string* _internal_add_$name$();\npublic:\n"
             ,args);
  if (CVar1 != CVar2) {
    io::Printer::Outdent(local_60.printer_);
    Formatter::operator()<>(&local_60," public:\n");
    io::Printer::Indent(local_60.printer_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60.vars_._M_t);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // See comment above about unknown ctypes.
  bool unknown_ctype = descriptor_->options().ctype() !=
                       EffectiveStringCType(descriptor_, options_);

  if (unknown_ctype) {
    format.Outdent();
    format(
        " private:\n"
        "  // Hidden due to unknown ctype option.\n");
    format.Indent();
  }

  format(
      "$deprecated_attr$const std::string& ${1$$name$$}$(int index) const;\n"
      "$deprecated_attr$std::string* ${1$mutable_$name$$}$(int index);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "std::string& value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, std::string&& "
      "value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$set_$name$$}$(int index, "
        "StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$set_$name$$}$("
      "int index, const $pointer_type$* value, size_t size);\n"
      "$deprecated_attr$std::string* ${1$add_$name$$}$();\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const std::string& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(std::string&& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$add_$name$$}$(StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$add_$name$$}$(const $pointer_type$* "
      "value, size_t size)"
      ";\n"
      "$deprecated_attr$const ::$proto_ns$::RepeatedPtrField<std::string>& "
      "${1$$name$$}$() "
      "const;\n"
      "$deprecated_attr$::$proto_ns$::RepeatedPtrField<std::string>* "
      "${1$mutable_$name$$}$()"
      ";\n"
      "private:\n"
      "const std::string& ${1$_internal_$name$$}$(int index) const;\n"
      "std::string* _internal_add_$name$();\n"
      "public:\n",
      descriptor_);

  if (unknown_ctype) {
    format.Outdent();
    format(" public:\n");
    format.Indent();
  }
}